

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

long __thiscall
wasm::Random::pickGivenNum<long,unsigned_char,unsigned_short,unsigned_int,unsigned_long>
          (Random *this,size_t num,long first,uchar args,unsigned_short args_1,uint args_2,
          unsigned_long args_3)

{
  long lVar1;
  
  if (num != 0) {
    lVar1 = pickGivenNum<long,unsigned_short,unsigned_int,unsigned_long>
                      (this,num - 1,(ulong)args,args_1,args_2,args_3);
    return lVar1;
  }
  return first;
}

Assistant:

T pickGivenNum(size_t num, T first, Args... args) {
    if (num == 0) {
      return first;
    }
    return pickGivenNum<T>(num - 1, args...);
  }